

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglplatformcontext.cpp
# Opt level: O2

bool __thiscall
QEGLPlatformContext::makeCurrent(QEGLPlatformContext *this,QPlatformSurface *surface)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  EGLContext pvVar5;
  EGLDisplay pvVar6;
  long lVar7;
  bool bVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_68;
  char *local_50;
  bool intervalOk;
  long local_38;
  long lVar4;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  eglBindAPI(this->m_api);
  iVar2 = (*(this->super_QPlatformOpenGLContext)._vptr_QPlatformOpenGLContext[0x11])(this,surface);
  lVar4 = CONCAT44(extraout_var,iVar2);
  pvVar5 = (EGLContext)eglGetCurrentContext();
  if (pvVar5 == this->m_eglContext) {
    pvVar6 = (EGLDisplay)eglGetCurrentDisplay();
    if (pvVar6 != this->m_eglDisplay) goto LAB_00568010;
    lVar7 = eglGetCurrentSurface(0x305a);
    if (lVar7 != lVar4) goto LAB_00568010;
    lVar7 = eglGetCurrentSurface(0x3059);
    if (lVar7 != lVar4) goto LAB_00568010;
LAB_005680ec:
    bVar8 = true;
  }
  else {
LAB_00568010:
    iVar2 = eglMakeCurrent(this->m_eglDisplay,lVar4,lVar4,this->m_eglContext);
    if (iVar2 == 0) {
      local_68.d._0_4_ = 2;
      local_68.size._4_4_ = 0;
      local_68.d._4_4_ = 0;
      local_68.ptr._0_4_ = 0;
      local_68.ptr._4_4_ = 0;
      local_68.size._0_4_ = 0;
      local_50 = "default";
      uVar3 = eglGetError();
      bVar8 = false;
      QMessageLogger::warning
                ((char *)&local_68,"QEGLPlatformContext: eglMakeCurrent failed: %x",(ulong)uVar3);
      goto LAB_0056812a;
    }
    if (this->m_swapIntervalEnvChecked == false) {
      this->m_swapIntervalEnvChecked = true;
      cVar1 = qEnvironmentVariableIsSet("QT_QPA_EGLFS_SWAPINTERVAL");
      if (cVar1 != '\0') {
        local_68.size._0_4_ = 0xaaaaaaaa;
        local_68.size._4_4_ = 0xaaaaaaaa;
        local_68.d._0_4_ = 0xaaaaaaaa;
        local_68.d._4_4_ = 0xaaaaaaaa;
        local_68.ptr._0_4_ = 0xaaaaaaaa;
        local_68.ptr._4_4_ = 0xaaaaaaaa;
        qgetenv((char *)&local_68);
        intervalOk = true;
        iVar2 = QByteArray::toInt((bool *)&local_68,(int)&intervalOk);
        if (intervalOk == true) {
          this->m_swapIntervalFromEnv = iVar2;
        }
        QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      }
    }
    iVar2 = this->m_swapIntervalFromEnv;
    if (iVar2 < 0) {
      (*surface->_vptr_QPlatformSurface[2])(&local_68,surface);
      iVar2 = QSurfaceFormat::swapInterval((QSurfaceFormat *)&local_68);
      QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_68);
      if (iVar2 < 0) goto LAB_005680ec;
    }
    bVar8 = true;
    if ((this->m_swapInterval != iVar2) && (this->m_swapInterval = iVar2, lVar4 != 0)) {
      eglSwapInterval(this->m_eglDisplay,iVar2);
    }
  }
LAB_0056812a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool QEGLPlatformContext::makeCurrent(QPlatformSurface *surface)
{
    Q_ASSERT(surface->surface()->supportsOpenGL());

    eglBindAPI(m_api);

    EGLSurface eglSurface = eglSurfaceForPlatformSurface(surface);

    // shortcut: on some GPUs, eglMakeCurrent is not a cheap operation
    if (eglGetCurrentContext() == m_eglContext &&
        eglGetCurrentDisplay() == m_eglDisplay &&
        eglGetCurrentSurface(EGL_READ) == eglSurface &&
        eglGetCurrentSurface(EGL_DRAW) == eglSurface) {
        return true;
    }

    const bool ok = eglMakeCurrent(m_eglDisplay, eglSurface, eglSurface, m_eglContext);
    if (ok) {
        if (!m_swapIntervalEnvChecked) {
            m_swapIntervalEnvChecked = true;
            if (qEnvironmentVariableIsSet("QT_QPA_EGLFS_SWAPINTERVAL")) {
                QByteArray swapIntervalString = qgetenv("QT_QPA_EGLFS_SWAPINTERVAL");
                bool intervalOk;
                const int swapInterval = swapIntervalString.toInt(&intervalOk);
                if (intervalOk)
                    m_swapIntervalFromEnv = swapInterval;
            }
        }
        const int requestedSwapInterval = m_swapIntervalFromEnv >= 0
            ? m_swapIntervalFromEnv
            : surface->format().swapInterval();
        if (requestedSwapInterval >= 0 && m_swapInterval != requestedSwapInterval) {
            m_swapInterval = requestedSwapInterval;
            if (eglSurface != EGL_NO_SURFACE) // skip if using surfaceless context
                eglSwapInterval(eglDisplay(), m_swapInterval);
        }
#if defined(Q_OS_VXWORKS) && defined(Q_PROCESSOR_X86_64)
        // Clear set of framebuffers as workaround for display artifacts found
        // in Wind River's Mesa OpenGL implementation
        static bool firstWindow = true;
        if (firstWindow && (QSurface::Window == surface->surface()->surfaceClass())) {
            glClearColor(0.0f, 0.0f, 0.0f, 0.0f);
            glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
            swapBuffers(surface);
            glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
            swapBuffers(surface);
            glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
            swapBuffers(surface);
            firstWindow = false;
        }
#endif
    } else {
        qWarning("QEGLPlatformContext: eglMakeCurrent failed: %x", eglGetError());
    }

    return ok;
}